

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDFace::ReplaceEdgeInArray
          (ON_SubDFace *this,uint fei0,ON_SubDEdge *edge_to_remove,ON_SubDEdgePtr edgeptr_to_insert)

{
  ushort uVar1;
  ON_SubDEdge *pOVar2;
  uint local_44;
  ON_SubDEdgePtr *pOStack_40;
  uint fei;
  ON_SubDEdgePtr *eptr;
  uint face_edge_count;
  ON_SubDEdge *edge_to_remove_local;
  uint fei0_local;
  ON_SubDFace *this_local;
  ON_SubDEdgePtr edgeptr_to_insert_local;
  
  uVar1 = this->m_edge_count;
  pOStack_40 = this->m_edge4;
  local_44 = 0;
  while( true ) {
    if ((uVar1 <= local_44) ||
       ((local_44 == 4 && (pOStack_40 = this->m_edgex, pOStack_40 == (ON_SubDEdgePtr *)0x0)))) {
      return false;
    }
    if ((fei0 <= local_44) && (pOVar2 = ON_SubDEdgePtr::Edge(pOStack_40), edge_to_remove == pOVar2))
    break;
    local_44 = local_44 + 1;
    pOStack_40 = pOStack_40 + 1;
  }
  pOStack_40->m_ptr = edgeptr_to_insert.m_ptr;
  return true;
}

Assistant:

bool ON_SubDFace::ReplaceEdgeInArray(
  unsigned int fei0,
  ON_SubDEdge* edge_to_remove,
  ON_SubDEdgePtr edgeptr_to_insert
)
{
  const unsigned int face_edge_count = m_edge_count;
  ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned int fei = 0; fei < face_edge_count; fei++, eptr++)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    if (fei >= fei0 && edge_to_remove == eptr->Edge() )
    {
      *eptr = edgeptr_to_insert;
      return true;
    }
  }
  return false;
}